

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_cdn_describe_cdn_domain_detail.cc
# Opt level: O0

void anon_unknown.dwarf_18803::Json2Type
               (Value *value,CdnDescribeCdnDomainDetailGetDomainDetailModelType *item)

{
  bool bVar1;
  Value *pVVar2;
  Json2Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_139;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  CdnDescribeCdnDomainDetailGetDomainDetailModelType *local_18;
  CdnDescribeCdnDomainDetailGetDomainDetailModelType *item_local;
  Value *value_local;
  
  local_18 = item;
  item_local = (CdnDescribeCdnDomainDetailGetDomainDetailModelType *)value;
  bVar1 = Json::Value::isMember(value,"GmtCreated");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"GmtCreated");
    Json::Value::asString_abi_cxx11_(&local_38,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->gmt_created,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"GmtModified");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"GmtModified");
    Json::Value::asString_abi_cxx11_(&local_58,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->gmt_modified,(string *)&local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"SourceType");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"SourceType");
    Json::Value::asString_abi_cxx11_(&local_78,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->source_type,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"DomainStatus");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"DomainStatus");
    Json::Value::asString_abi_cxx11_(&local_98,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->domain_status,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"CdnType");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"CdnType");
    Json::Value::asString_abi_cxx11_(&local_b8,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->cdn_type,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"Cname");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"Cname");
    Json::Value::asString_abi_cxx11_(&local_d8,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->cname,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"HttpsCname");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"HttpsCname");
    Json::Value::asString_abi_cxx11_(&local_f8,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->https_cname,(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"DomainName");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"DomainName");
    Json::Value::asString_abi_cxx11_(&local_118,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->domain_name,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"Remark");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"Remark");
    Json::Value::asString_abi_cxx11_(&local_138,pVVar2);
    std::__cxx11::string::operator=((string *)&local_18->remark,(string *)&local_138);
    std::__cxx11::string::~string((string *)&local_138);
  }
  bVar1 = Json::Value::isMember((Value *)item_local,"Sources");
  if (bVar1) {
    pVVar2 = Json::Value::operator[]((Value *)item_local,"Sources");
    bVar1 = Json::Value::isMember(pVVar2,"Source");
    if (bVar1) {
      pVVar2 = Json::Value::operator[]((Value *)item_local,"Sources");
      pVVar2 = Json::Value::operator[](pVVar2,"Source");
      Json2Array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      Json2Array(&local_139,pVVar2,&local_18->sources);
    }
  }
  return;
}

Assistant:

void Json2Type(const Json::Value& value, CdnDescribeCdnDomainDetailGetDomainDetailModelType* item) {
  if(value.isMember("GmtCreated")) {
    item->gmt_created = value["GmtCreated"].asString();
  }
  if(value.isMember("GmtModified")) {
    item->gmt_modified = value["GmtModified"].asString();
  }
  if(value.isMember("SourceType")) {
    item->source_type = value["SourceType"].asString();
  }
  if(value.isMember("DomainStatus")) {
    item->domain_status = value["DomainStatus"].asString();
  }
  if(value.isMember("CdnType")) {
    item->cdn_type = value["CdnType"].asString();
  }
  if(value.isMember("Cname")) {
    item->cname = value["Cname"].asString();
  }
  if(value.isMember("HttpsCname")) {
    item->https_cname = value["HttpsCname"].asString();
  }
  if(value.isMember("DomainName")) {
    item->domain_name = value["DomainName"].asString();
  }
  if(value.isMember("Remark")) {
    item->remark = value["Remark"].asString();
  }
  if(value.isMember("Sources")  && value["Sources"].isMember("Source")) {
    Json2Array<std::string>(value["Sources"]["Source"], &item->sources);
  }
}